

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmenc.cc
# Opt level: O2

int write_webm_block(WebmOutputContext *webm_ctx,aom_codec_enc_cfg_t *cfg,aom_codec_cx_pkt_t *pkt)

{
  bool bVar1;
  uint64_t uVar2;
  char *__ptr;
  uint64_t timestamp;
  
  if ((Segment *)webm_ctx->segment == (Segment *)0x0) {
    __ptr = "webmenc> segment is NULL.\n";
  }
  else {
    uVar2 = ((long)(cfg->g_timebase).num * (pkt->data).frame.pts * 1000000000) /
            (long)(cfg->g_timebase).den;
    timestamp = webm_ctx->last_pts_ns + 1000000;
    if (webm_ctx->last_pts_ns < (long)uVar2) {
      timestamp = uVar2;
    }
    webm_ctx->last_pts_ns = timestamp;
    bVar1 = mkvmuxer::Segment::AddFrame
                      ((Segment *)webm_ctx->segment,(uint8_t *)(pkt->data).frame.buf,
                       (pkt->data).frame.sz,1,timestamp,(bool)((byte)(pkt->data).frame.flags & 1));
    if (bVar1) {
      return 0;
    }
    __ptr = "webmenc> AddFrame failed.\n";
  }
  fwrite(__ptr,0x1a,1,_stderr);
  return -1;
}

Assistant:

int write_webm_block(struct WebmOutputContext *webm_ctx,
                     const aom_codec_enc_cfg_t *cfg,
                     const aom_codec_cx_pkt_t *pkt) {
  if (!webm_ctx->segment) {
    fprintf(stderr, "webmenc> segment is NULL.\n");
    return -1;
  }
  mkvmuxer::Segment *const segment =
      reinterpret_cast<mkvmuxer::Segment *>(webm_ctx->segment);
  int64_t pts_ns = pkt->data.frame.pts * 1000000000ll * cfg->g_timebase.num /
                   cfg->g_timebase.den;
  if (pts_ns <= webm_ctx->last_pts_ns) pts_ns = webm_ctx->last_pts_ns + 1000000;
  webm_ctx->last_pts_ns = pts_ns;

  if (!segment->AddFrame(static_cast<uint8_t *>(pkt->data.frame.buf),
                         pkt->data.frame.sz, kVideoTrackNumber, pts_ns,
                         pkt->data.frame.flags & AOM_FRAME_IS_KEY)) {
    fprintf(stderr, "webmenc> AddFrame failed.\n");
    return -1;
  }
  return 0;
}